

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlutils.cpp
# Opt level: O0

bool QXmlUtils::isNameChar(QChar c)

{
  bool bVar1;
  char16_t cVar2;
  char16_t in_DI;
  long in_FS_OFFSET;
  bool local_15;
  QChar in_stack_ffffffffffffffee;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_a.ucs = in_DI;
  bVar1 = isBaseChar(in_stack_ffffffffffffffee);
  local_15 = true;
  if (!bVar1) {
    bVar1 = isDigit(in_stack_ffffffffffffffee);
    local_15 = true;
    if (!bVar1) {
      cVar2 = QChar::unicode(&local_a);
      local_15 = true;
      if (cVar2 != L'.') {
        cVar2 = QChar::unicode(&local_a);
        local_15 = true;
        if (cVar2 != L'-') {
          cVar2 = QChar::unicode(&local_a);
          local_15 = true;
          if (cVar2 != L'_') {
            cVar2 = QChar::unicode(&local_a);
            local_15 = true;
            if (cVar2 != L':') {
              bVar1 = isCombiningChar(in_stack_ffffffffffffffee);
              local_15 = true;
              if (!bVar1) {
                bVar1 = isIdeographic(local_a);
                local_15 = true;
                if (!bVar1) {
                  local_15 = isExtender(local_a);
                }
              }
            }
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_15;
  }
  __stack_chk_fail();
}

Assistant:

bool QXmlUtils::isNameChar(const QChar c)
{
    return isBaseChar(c)
           || isDigit(c)
           || c.unicode() == '.'
           || c.unicode() == '-'
           || c.unicode() == '_'
           || c.unicode() == ':'
           || isCombiningChar(c)
           || isIdeographic(c)
           || isExtender(c);
}